

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O2

mchunkptr try_realloc_chunk(mstate m,mchunkptr p,size_t nb,int can_move)

{
  tbinptr pmVar1;
  byte *pbVar2;
  uint uVar3;
  ulong uVar4;
  malloc_tree_chunk *pmVar5;
  malloc_tree_chunk *pmVar6;
  byte bVar7;
  char *pcVar8;
  tbinptr pmVar9;
  malloc_tree_chunk **ppmVar10;
  mchunkptr p_00;
  ulong uVar11;
  uint uVar12;
  size_t psize;
  size_t newsize;
  size_t newsize_1;
  mchunkptr pmVar13;
  tbinptr pmVar14;
  malloc_tree_chunk **ppmVar15;
  
  if (m < _gm_.least_addr) goto LAB_00107877;
  uVar11 = m->dvsize;
  uVar12 = (uint)uVar11;
  if (((uVar12 & 3) == 1) || (pmVar13 = (mchunkptr)(uVar11 & 0xfffffffffffffff8), (long)pmVar13 < 1)
     ) goto LAB_00107877;
  pmVar1 = (tbinptr)((long)((malloc_state *)(m->smallbins + -9))->smallbins + (long)&pmVar13[-3].bk)
  ;
  uVar4 = pmVar1->head;
  if ((uVar4 & 1) == 0) goto LAB_00107877;
  if ((uVar11 & 3) == 0) {
    if (p < (mchunkptr)0x100) {
      return (mchunkptr)0x0;
    }
    if (pmVar13 < &p->head) {
      return (mchunkptr)0x0;
    }
    if (mparams.granularity * 2 < (ulong)((long)pmVar13 - (long)p)) {
      return (mchunkptr)0x0;
    }
    return (mchunkptr)m;
  }
  p_00 = (mchunkptr)((long)pmVar13 - (long)p);
  if (p <= pmVar13) {
    if (p_00 < (mchunkptr)&DAT_00000020) {
      return (mchunkptr)m;
    }
    psize = (ulong)(uVar12 & 1) | (ulong)p | 2;
    m->dvsize = psize;
    *(ulong *)((long)&m->dvsize + (long)p) = (ulong)p_00 | 3;
    *(byte *)&pmVar1->head = (byte)pmVar1->head | 1;
    goto LAB_001076a5;
  }
  if (pmVar1 == (tbinptr)_gm_.top) {
    pmVar13 = (mchunkptr)((long)&pmVar13->prev_foot + _gm_.topsize);
    uVar11 = (long)pmVar13 - (long)p;
    if (pmVar13 < p || uVar11 == 0) {
      return (mchunkptr)0x0;
    }
    m->dvsize = (ulong)(uVar12 & 1) | (ulong)p | 2;
    *(ulong *)((long)&m->dvsize + (long)p) = uVar11 | 1;
    _gm_.topsize = uVar11;
    _gm_.top = (mchunkptr)((long)((malloc_state *)(m->smallbins + -9))->smallbins + (long)&p[-3].bk)
    ;
    return (mchunkptr)m;
  }
  if (pmVar1 == (tbinptr)_gm_.dv) {
    pmVar13 = (mchunkptr)((long)&pmVar13->prev_foot + _gm_.dvsize);
    uVar11 = (long)pmVar13 - (long)p;
    if (pmVar13 < p) {
      return (mchunkptr)0x0;
    }
    if (uVar11 < 0x20) {
      m->dvsize = (ulong)(uVar12 & 1) | (ulong)pmVar13 | 2;
      pbVar2 = (byte *)((long)&m->dvsize + (long)pmVar13);
      *pbVar2 = *pbVar2 | 1;
      _gm_.dvsize = 0;
      _gm_.dv = (mchunkptr)0x0;
      return (mchunkptr)m;
    }
    m->dvsize = (ulong)(uVar12 & 1) | (ulong)p | 2;
    *(ulong *)((long)&m->dvsize + (long)p) = uVar11 | 1;
    *(ulong *)((long)((malloc_state *)(m->smallbins + -9))->smallbins + (long)&pmVar13[-3].bk) =
         uVar11;
    pbVar2 = (byte *)((long)&m->dvsize + (long)pmVar13);
    *pbVar2 = *pbVar2 & 0xfe;
    _gm_.dvsize = uVar11;
    _gm_.dv = (mchunkptr)((long)((malloc_state *)(m->smallbins + -9))->smallbins + (long)&p[-3].bk);
    return (mchunkptr)m;
  }
  if ((uVar4 & 2) != 0) {
    return (mchunkptr)0x0;
  }
  pmVar13 = (mchunkptr)((long)&pmVar13->prev_foot + (uVar4 & 0xfffffffffffffff8));
  p_00 = (mchunkptr)((long)pmVar13 - (long)p);
  if (pmVar13 < p) {
    return (mchunkptr)0x0;
  }
  if (uVar4 < 0x100) {
    pmVar5 = pmVar1->fd;
    pmVar6 = pmVar1->bk;
    if ((pmVar5 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar4 >> 3) * 2)) &&
       ((pmVar5 < _gm_.least_addr || (pmVar5->bk != pmVar1)))) goto LAB_00107877;
    if (pmVar6 == pmVar5) {
      bVar7 = (byte)(uVar4 >> 3) & 0x1f;
      _gm_.smallmap = _gm_.smallmap & (-2 << bVar7 | 0xfffffffeU >> 0x20 - bVar7);
    }
    else {
      if ((pmVar6 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar4 >> 3) * 2)) &&
         ((pmVar6 < _gm_.least_addr || (pmVar6->fd != pmVar1)))) goto LAB_00107877;
      pmVar5->bk = pmVar6;
      pmVar6->fd = pmVar5;
    }
  }
  else {
    pmVar14 = pmVar1->bk;
    pmVar5 = pmVar1->parent;
    if (pmVar14 == pmVar1) {
      if (pmVar1->child[1] == (tbinptr)0x0) {
        if (pmVar1->child[0] == (tbinptr)0x0) {
          pmVar14 = (tbinptr)0x0;
          goto LAB_001077f0;
        }
        pmVar9 = pmVar1->child[0];
        ppmVar10 = pmVar1->child;
      }
      else {
        pmVar9 = pmVar1->child[1];
        ppmVar10 = pmVar1->child + 1;
      }
      do {
        do {
          ppmVar15 = ppmVar10;
          pmVar14 = pmVar9;
          pmVar9 = pmVar14->child[1];
          ppmVar10 = pmVar14->child + 1;
        } while (pmVar14->child[1] != (malloc_tree_chunk *)0x0);
        pmVar9 = pmVar14->child[0];
        ppmVar10 = pmVar14->child;
      } while (pmVar14->child[0] != (malloc_tree_chunk *)0x0);
      if (ppmVar15 < _gm_.least_addr) goto LAB_00107877;
      *ppmVar15 = (malloc_tree_chunk *)0x0;
    }
    else {
      pmVar6 = pmVar1->fd;
      if (((pmVar6 < _gm_.least_addr) || (pmVar6->bk != pmVar1)) || (pmVar14->fd != pmVar1))
      goto LAB_00107877;
      pmVar6->bk = pmVar14;
      pmVar14->fd = pmVar6;
    }
LAB_001077f0:
    if (pmVar5 != (malloc_tree_chunk *)0x0) {
      uVar3 = pmVar1->index;
      if (pmVar1 == _gm_.treebins[uVar3]) {
        _gm_.treebins[uVar3] = pmVar14;
        if (pmVar14 == (tbinptr)0x0) {
          bVar7 = (byte)uVar3 & 0x1f;
          _gm_.treemap = _gm_.treemap & (-2 << bVar7 | 0xfffffffeU >> 0x20 - bVar7);
        }
        else {
LAB_00107839:
          pcVar8 = _gm_.least_addr;
          if (pmVar14 < _gm_.least_addr) {
LAB_00107877:
            abort();
          }
          pmVar14->parent = pmVar5;
          pmVar5 = pmVar1->child[0];
          if (pmVar5 != (malloc_tree_chunk *)0x0) {
            if (pmVar5 < pcVar8) goto LAB_00107877;
            pmVar14->child[0] = pmVar5;
            pmVar5->parent = pmVar14;
          }
          pmVar5 = pmVar1->child[1];
          if (pmVar5 != (malloc_tree_chunk *)0x0) {
            if (pmVar5 < pcVar8) goto LAB_00107877;
            pmVar14->child[1] = pmVar5;
            pmVar5->parent = pmVar14;
          }
        }
      }
      else {
        if (pmVar5 < _gm_.least_addr) goto LAB_00107877;
        pmVar5->child[pmVar5->child[0] != pmVar1] = pmVar14;
        if (pmVar14 != (tbinptr)0x0) goto LAB_00107839;
      }
    }
  }
  if (p_00 < (mchunkptr)&DAT_00000020) {
    m->dvsize = (long)&pmVar13->prev_foot + (ulong)(uVar12 & 1) + 2;
    pbVar2 = (byte *)((long)&m->dvsize + (long)pmVar13);
    *pbVar2 = *pbVar2 | 1;
    return (mchunkptr)m;
  }
  psize = (ulong)(uVar12 & 1) | (ulong)p | 2;
  m->dvsize = psize;
  *(ulong *)((long)&m->dvsize + (long)p) = (ulong)p_00 | 3;
  pbVar2 = (byte *)((long)&m->dvsize + (long)pmVar13);
  *pbVar2 = *pbVar2 | 1;
LAB_001076a5:
  dispose_chunk((mstate)((long)((malloc_state *)(m->smallbins + -9))->smallbins + (long)&p[-3].bk),
                p_00,psize);
  return (mchunkptr)m;
}

Assistant:

static mchunkptr try_realloc_chunk(mstate m, mchunkptr p, size_t nb,
                                   int can_move) {
  mchunkptr newp = 0;
  size_t oldsize = chunksize(p);
  mchunkptr next = chunk_plus_offset(p, oldsize);
  if (RTCHECK(ok_address(m, p) && ok_inuse(p) &&
              ok_next(p, next) && ok_pinuse(next))) {
    if (is_mmapped(p)) {
      newp = mmap_resize(m, p, nb, can_move);
    }
    else if (oldsize >= nb) {             /* already big enough */
      size_t rsize = oldsize - nb;
      if (rsize >= MIN_CHUNK_SIZE) {      /* split off remainder */
        mchunkptr r = chunk_plus_offset(p, nb);
        set_inuse(m, p, nb);
        set_inuse(m, r, rsize);
        dispose_chunk(m, r, rsize);
      }
      newp = p;
    }
    else if (next == m->top) {  /* extend into top */
      if (oldsize + m->topsize > nb) {
        size_t newsize = oldsize + m->topsize;
        size_t newtopsize = newsize - nb;
        mchunkptr newtop = chunk_plus_offset(p, nb);
        set_inuse(m, p, nb);
        newtop->head = newtopsize |PINUSE_BIT;
        m->top = newtop;
        m->topsize = newtopsize;
        newp = p;
      }
    }
    else if (next == m->dv) { /* extend into dv */
      size_t dvs = m->dvsize;
      if (oldsize + dvs >= nb) {
        size_t dsize = oldsize + dvs - nb;
        if (dsize >= MIN_CHUNK_SIZE) {
          mchunkptr r = chunk_plus_offset(p, nb);
          mchunkptr n = chunk_plus_offset(r, dsize);
          set_inuse(m, p, nb);
          set_size_and_pinuse_of_free_chunk(r, dsize);
          clear_pinuse(n);
          m->dvsize = dsize;
          m->dv = r;
        }
        else { /* exhaust dv */
          size_t newsize = oldsize + dvs;
          set_inuse(m, p, newsize);
          m->dvsize = 0;
          m->dv = 0;
        }
        newp = p;
      }
    }
    else if (!cinuse(next)) { /* extend into next free chunk */
      size_t nextsize = chunksize(next);
      if (oldsize + nextsize >= nb) {
        size_t rsize = oldsize + nextsize - nb;
        unlink_chunk(m, next, nextsize);
        if (rsize < MIN_CHUNK_SIZE) {
          size_t newsize = oldsize + nextsize;
          set_inuse(m, p, newsize);
        }
        else {
          mchunkptr r = chunk_plus_offset(p, nb);
          set_inuse(m, p, nb);
          set_inuse(m, r, rsize);
          dispose_chunk(m, r, rsize);
        }
        newp = p;
      }
    }
  }
  else {
    USAGE_ERROR_ACTION(m, chunk2mem(p));
  }
  return newp;
}